

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_shake.h
# Opt level: O0

void hash_squeeze_x4_4(hash_context_x4 *ctx,uint8_t *buffer0,uint8_t *buffer1,uint8_t *buffer2,
                      uint8_t *buffer3,size_t buflen)

{
  hash_context_x4 *in_RDX;
  uint8_t **in_RSI;
  uint8_t *buffer [4];
  
  hash_squeeze_x4(in_RDX,in_RSI,0x14182b);
  return;
}

Assistant:

static inline void hash_squeeze_x4_4(hash_context_x4* ctx, uint8_t* buffer0, uint8_t* buffer1,
                                     uint8_t* buffer2, uint8_t* buffer3, size_t buflen) {
  uint8_t* buffer[4] = {buffer0, buffer1, buffer2, buffer3};
  hash_squeeze_x4(ctx, buffer, buflen);
}